

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_sqrt_estimate(sexp ctx,sexp a)

{
  sexp_uint_t sVar1;
  uint uVar2;
  sexp psVar3;
  uint uVar4;
  int iVar5;
  sexp_uint_t sVar6;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  sVar1 = (a->value).string.offset;
  do {
    sVar6 = sVar1;
    if (sVar6 == 1) {
      sVar6 = 1;
      break;
    }
    sVar1 = sVar6 - 1;
  } while (*(long *)((long)&a->value + sVar6 * 8 + 8) == 0);
  local_40 = (sexp)0x43e;
  uVar2 = 0x40;
  do {
    uVar4 = uVar2 - 1;
    uVar2 = uVar2 - 1;
    if ((*(ulong *)((long)&a->value + sVar6 * 8 + 8) >> ((ulong)(uVar4 & 0xff) & 0x3f) & 1) != 0)
    goto LAB_0011b9a9;
  } while (1 < uVar2);
  uVar2 = 0;
LAB_0011b9a9:
  iVar5 = ((int)sVar6 + -1) * 0x40;
  local_38.var = &local_40;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000005);
  psVar3 = sexp_bignum_expt(ctx,local_40,
                            (sexp)((long)((int)(((iVar5 + uVar2) -
                                                ((int)(uVar2 + iVar5 + 1) >> 0x1f)) + 1) >> 1) * 2 +
                                  1));
  (ctx->value).context.saves = local_38.next;
  return psVar3;
}

Assistant:

sexp sexp_bignum_sqrt_estimate (sexp ctx, sexp a) {
  sexp_uint_t alen=sexp_bignum_hi(a), adata_hi;
  int nbits, i;
  sexp_gc_var1(res);

  adata_hi = sexp_bignum_data(a)[alen - 1];
  for (i = sizeof(sexp_uint_t)*8-1; i > 0; i--)
    if (adata_hi & (1ul << i))
      break;
  nbits = sizeof(sexp_uint_t) * 8 * (alen - 1) + i + 1;

  sexp_gc_preserve1(ctx, res);
  res = sexp_fixnum_to_bignum(ctx, SEXP_TWO);
  res = sexp_bignum_expt(ctx, res, sexp_make_fixnum(nbits / 2));
  sexp_gc_release1(ctx);
  return res;
}